

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O0

int tinf_decode_symbol(tinf_data *d,tinf_tree *t)

{
  uint uVar1;
  int local_24;
  int local_20;
  int len;
  int offs;
  int base;
  tinf_tree *t_local;
  tinf_data *d_local;
  
  len = 0;
  local_20 = 0;
  local_24 = 1;
  while( true ) {
    uVar1 = tinf_getbits(d,1);
    local_20 = local_20 * 2 + uVar1;
    if (0xf < local_24) {
      __assert_fail("len <= 15",
                    "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/src/tinflate.c"
                    ,0xf7,"int tinf_decode_symbol(struct tinf_data *, const struct tinf_tree *)");
    }
    if (local_20 < (int)(uint)t->counts[local_24]) break;
    len = (uint)t->counts[local_24] + len;
    local_20 = local_20 - (uint)t->counts[local_24];
    local_24 = local_24 + 1;
  }
  if ((-1 < len + local_20) && (len + local_20 < 0x120)) {
    return (int)t->symbols[len + local_20];
  }
  __assert_fail("base + offs >= 0 && base + offs < 288",
                "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/src/tinflate.c",
                0x101,"int tinf_decode_symbol(struct tinf_data *, const struct tinf_tree *)");
}

Assistant:

static int tinf_decode_symbol(struct tinf_data *d, const struct tinf_tree *t)
{
	int base = 0, offs = 0;
	int len;

	/*
	 * Get more bits while code index is above number of codes
	 *
	 * Rather than the actual code, we are computing the position of the
	 * code in the sorted order of codes, which is the index of the
	 * corresponding symbol.
	 *
	 * Conceptually, for each code length (level in the tree), there are
	 * counts[len] leaves on the left and internal nodes on the right.
	 * The index we have decoded so far is base + offs, and if that
	 * falls within the leaves we are done. Otherwise we adjust the range
	 * of offs and add one more bit to it.
	 */
	for (len = 1; ; ++len) {
		offs = 2 * offs + tinf_getbits(d, 1);

		assert(len <= 15);

		if (offs < t->counts[len]) {
			break;
		}

		base += t->counts[len];
		offs -= t->counts[len];
	}

	assert(base + offs >= 0 && base + offs < 288);

	return t->symbols[base + offs];
}